

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O0

void cmInstallGenerator::AddTweak
               (ostream *os,Indent indent,string *config,string *file,TweakMethod *tweak)

{
  cmScriptGeneratorIndent __args_1;
  ulong uVar1;
  ostream *poVar2;
  string local_1e0 [8];
  string tws;
  undefined1 local_1a8 [8];
  ostringstream tw;
  TweakMethod *tweak_local;
  string *file_local;
  string *config_local;
  ostream *os_local;
  Indent indent_local;
  
  os_local._4_4_ = indent.Level;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  __args_1 = cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&os_local + 4),2);
  std::
  function<void_(std::basic_ostream<char,_std::char_traits<char>_>_&,_cmScriptGeneratorIndent,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::operator()(tweak,(basic_ostream<char,_std::char_traits<char>_> *)local_1a8,__args_1,config,file)
  ;
  std::__cxx11::ostringstream::str();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)os_local._4_4_);
    poVar2 = std::operator<<(poVar2,"if(EXISTS \"");
    poVar2 = std::operator<<(poVar2,(string *)file);
    poVar2 = std::operator<<(poVar2,"\" AND\n");
    poVar2 = ::operator<<(poVar2,(cmScriptGeneratorIndent)os_local._4_4_);
    poVar2 = std::operator<<(poVar2,"   NOT IS_SYMLINK \"");
    poVar2 = std::operator<<(poVar2,(string *)file);
    std::operator<<(poVar2,"\")\n");
    std::operator<<(os,local_1e0);
    poVar2 = ::operator<<(os,(cmScriptGeneratorIndent)os_local._4_4_);
    std::operator<<(poVar2,"endif()\n");
  }
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return;
}

Assistant:

void cmInstallGenerator::AddTweak(std::ostream& os, Indent indent,
                                  const std::string& config,
                                  std::string const& file,
                                  const TweakMethod& tweak)
{
  std::ostringstream tw;
  tweak(tw, indent.Next(), config, file);
  std::string tws = tw.str();
  if (!tws.empty()) {
    os << indent << "if(EXISTS \"" << file << "\" AND\n"
       << indent << "   NOT IS_SYMLINK \"" << file << "\")\n";
    os << tws;
    os << indent << "endif()\n";
  }
}